

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O1

CURLcode ossl_seed(Curl_easy *data)

{
  int iVar1;
  CURLcode CVar2;
  
  if ((data->multi == (Curl_multi *)0x0) || (CVar2 = CURLE_OK, data->multi->ssl_seeded == false)) {
    iVar1 = RAND_status();
    if (iVar1 == 0) {
      Curl_failf(data,"Insufficient randomness");
      CVar2 = CURLE_SSL_CONNECT_ERROR;
    }
    else {
      CVar2 = CURLE_OK;
      if (data->multi != (Curl_multi *)0x0) {
        data->multi->ssl_seeded = true;
      }
    }
  }
  return CVar2;
}

Assistant:

static CURLcode ossl_seed(struct Curl_easy *data)
{
  /* This might get called before it has been added to a multi handle */
  if(data->multi && data->multi->ssl_seeded)
    return CURLE_OK;

  if(rand_enough()) {
    /* OpenSSL 1.1.0+ should return here */
    if(data->multi)
      data->multi->ssl_seeded = TRUE;
    return CURLE_OK;
  }
#ifdef HAVE_RANDOM_INIT_BY_DEFAULT
  /* with OpenSSL 1.1.0+, a failed RAND_status is a showstopper */
  failf(data, "Insufficient randomness");
  return CURLE_SSL_CONNECT_ERROR;
#else

#ifdef RANDOM_FILE
  RAND_load_file(RANDOM_FILE, RAND_LOAD_LENGTH);
  if(rand_enough())
    return CURLE_OK;
#endif

#if defined(HAVE_RAND_EGD) && defined(EGD_SOCKET)
  /* available in OpenSSL 0.9.5 and later */
  /* EGD_SOCKET is set at configure time or not at all */
  {
    /* If there's an option and a define, the option overrides the
       define */
    int ret = RAND_egd(EGD_SOCKET);
    if(-1 != ret) {
      if(rand_enough())
        return CURLE_OK;
    }
  }
#endif

  /* fallback to a custom seeding of the PRNG using a hash based on a current
     time */
  do {
    unsigned char randb[64];
    size_t len = sizeof(randb);
    size_t i, i_max;
    for(i = 0, i_max = len / sizeof(struct curltime); i < i_max; ++i) {
      struct curltime tv = Curl_now();
      Curl_wait_ms(1);
      tv.tv_sec *= i + 1;
      tv.tv_usec *= (unsigned int)i + 2;
      tv.tv_sec ^= ((Curl_now().tv_sec + Curl_now().tv_usec) *
                    (i + 3)) << 8;
      tv.tv_usec ^= (unsigned int) ((Curl_now().tv_sec +
                                     Curl_now().tv_usec) *
                                    (i + 4)) << 16;
      memcpy(&randb[i * sizeof(struct curltime)], &tv,
             sizeof(struct curltime));
    }
    RAND_add(randb, (int)len, (double)len/2);
  } while(!rand_enough());

  {
    /* generates a default path for the random seed file */
    char fname[256];
    fname[0] = 0; /* blank it first */
    RAND_file_name(fname, sizeof(fname));
    if(fname[0]) {
      /* we got a file name to try */
      RAND_load_file(fname, RAND_LOAD_LENGTH);
      if(rand_enough())
        return CURLE_OK;
    }
  }

  infof(data, "libcurl is now using a weak random seed");
  return (rand_enough() ? CURLE_OK :
          CURLE_SSL_CONNECT_ERROR /* confusing error code */);
#endif
}